

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O2

int b_rot(lua_State *L,lua_Integer d)

{
  int extraout_EAX;
  ulong uVar1;
  ulong n;
  
  uVar1 = luaL_checkinteger(L,1);
  n = uVar1 & 0xffffffff;
  if ((d & 0x1fU) != 0) {
    n = uVar1 << ((byte)d & 0x1f) & 0xffffffff | n >> ((ulong)-(((uint)d & 0x1f) + 0x20) & 0x3f);
  }
  lua_pushinteger(L,n);
  return extraout_EAX;
}

Assistant:

static int b_rot (lua_State *L, lua_Integer d) {
  lua_Unsigned r = checkunsigned(L, 1);
  int i = d & (LUA_NBITS - 1);  /* i = d % NBITS */
  r = trim(r);
  if (i != 0)  /* avoid undefined shift of LUA_NBITS when i == 0 */
    r = (r << i) | (r >> (LUA_NBITS - i));
  pushunsigned(L, trim(r));
  return 1;
}